

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

string * findTestDir_abi_cxx11_(void)

{
  bool bVar1;
  int iVar2;
  string *in_RDI;
  path pStack_a8;
  path local_80;
  path path_1;
  
  if (findTestDir[abi:cxx11]()::path_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&findTestDir[abi:cxx11]()::path_abi_cxx11_);
    if (iVar2 != 0) {
      std::filesystem::current_path_abi_cxx11_();
      while( true ) {
        std::filesystem::__cxx11::path::path<char[6],std::filesystem::__cxx11::path>
                  (&pStack_a8,(char (*) [6])0x8bc16a,auto_format);
        std::filesystem::__cxx11::operator/(&local_80,&path_1,&pStack_a8);
        bVar1 = std::filesystem::exists(&local_80);
        std::filesystem::__cxx11::path::~path(&local_80);
        std::filesystem::__cxx11::path::~path(&pStack_a8);
        if (bVar1) break;
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::operator=(&path_1,&local_80);
        std::filesystem::__cxx11::path::~path(&local_80);
      }
      std::filesystem::__cxx11::path::path<char[22],std::filesystem::__cxx11::path>
                (&pStack_a8,(char (*) [22])"tests/unittests/data/",auto_format);
      std::filesystem::__cxx11::operator/(&local_80,&path_1,&pStack_a8);
      std::filesystem::__cxx11::path::string(&findTestDir[abi:cxx11]()::path_abi_cxx11_,&local_80);
      std::filesystem::__cxx11::path::~path(&local_80);
      std::filesystem::__cxx11::path::~path(&pStack_a8);
      std::filesystem::__cxx11::path::~path(&path_1);
      __cxa_atexit(std::__cxx11::string::~string,&findTestDir[abi:cxx11]()::path_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&findTestDir[abi:cxx11]()::path_abi_cxx11_);
    }
  }
  std::__cxx11::string::string((string *)in_RDI,&findTestDir[abi:cxx11]()::path_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string findTestDir() {
    static auto path = findTestDirInternal();
    return path;
}